

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  _Base_ptr p_Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  cmLocalUnixMakefileGenerator3 *pcVar5;
  size_type sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer pbVar9;
  bool bVar10;
  int iVar11;
  string *psVar12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  _Rb_tree_node_base *p_Var15;
  ostream *poVar16;
  _Base_ptr p_Var17;
  char *pcVar18;
  size_t sVar19;
  cmState *pcVar20;
  _Base_ptr p_Var21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var22;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  _Rb_tree_header *p_Var24;
  _Alloc_hider str;
  string *include;
  string smodSep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string binaryDir;
  string cidVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  undefined1 local_2c0 [32];
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  cmLocalUnixMakefileGenerator3 *local_280;
  string local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  long local_248 [3];
  _Rb_tree_node_base *local_230;
  cmGeneratorTarget *local_228;
  _Rb_tree_node_base *local_220;
  uint *local_218;
  long local_210;
  uint local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  uint *local_1f8;
  long local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  _Iter_pred<(anonymous_namespace)::NotInProjectDir> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  ostream *local_138;
  string local_130;
  string local_110;
  uint *local_f0;
  long local_e8;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  uint *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Base_ptr local_40;
  string *local_38;
  
  local_228 = target;
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  p_Var13 = (_Rb_tree_node_base *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
            ::operator[](&(this->ImplicitDepends).
                          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
                         ,psVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of languages for which implicit dependencies are needed:\n",
             0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n",0x1c);
  p_Var24 = (_Rb_tree_header *)&p_Var13->_M_parent;
  local_220 = p_Var13;
  for (p_Var15 = p_Var13->_M_right; (_Rb_tree_header *)p_Var15 != p_Var24;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (cmakefileStream,*(char **)(p_Var15 + 1),(long)p_Var15[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of files for implicit dependencies of each language:\n",0x3f
            );
  p_Var21 = local_220->_M_right;
  if ((_Rb_tree_header *)p_Var21 != p_Var24) {
    local_38 = &(this->super_cmLocalCommonGenerator).ConfigName;
    local_280 = this;
    local_138 = cmakefileStream;
    local_40 = (_Base_ptr)p_Var24;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"set(CMAKE_DEPENDS_CHECK_",0x18);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (cmakefileStream,*(char **)(p_Var21 + 1),(long)p_Var21[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      p_Var17 = p_Var21[2]._M_right;
      local_220 = (_Rb_tree_node_base *)&p_Var21[2]._M_parent;
      local_230 = p_Var21;
      if (p_Var17 != local_220) {
        do {
          poVar14 = local_138;
          p_Var1 = p_Var17[2]._M_parent;
          for (p_Var21 = *(_Base_ptr *)(p_Var17 + 2); p_Var21 != p_Var1; p_Var21 = p_Var21 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  \"",3);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,*(char **)p_Var21,(long)p_Var21->_M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"",1);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,*(char **)(p_Var17 + 1),(long)p_Var17[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\"\n",2);
          }
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
        } while (p_Var17 != local_220);
      }
      cmakefileStream = local_138;
      std::__ostream_insert<char,std::char_traits<char>>(local_138,"  )\n",4);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CMAKE_","");
      p_Var15 = local_230;
      std::__cxx11::string::_M_append((char *)&local_110,*(ulong *)(local_230 + 1));
      pcVar5 = local_280;
      std::__cxx11::string::append((char *)&local_110);
      pcVar18 = cmMakefile::GetDefinition
                          ((pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                           &local_110);
      if ((pcVar18 != (char *)0x0) && (*pcVar18 != '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,*(char **)(p_Var15 + 1),(long)p_Var15[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_COMPILER_ID \"",0xe);
        sVar19 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar18,sVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n",3);
      }
      p_Var21 = p_Var15 + 1;
      iVar11 = std::__cxx11::string::compare((char *)p_Var21);
      if (iVar11 == 0) {
        pcVar2 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"CMAKE_Fortran_SUBMODULE_SEP","");
        psVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_278);
        local_2c0._0_8_ = local_2c0 + 0x10;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,pcVar3,pcVar3 + psVar12->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_1d8._M_pred.SourceDir._M_dataplus._M_p = (pointer)&local_1d8._M_pred.SourceDir.field_2
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"CMAKE_Fortran_SUBMODULE_EXT","");
        psVar12 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&local_1d8);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar3,pcVar3 + psVar12->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_pred.SourceDir._M_dataplus._M_p != &local_1d8._M_pred.SourceDir.field_2)
        {
          operator_delete(local_1d8._M_pred.SourceDir._M_dataplus._M_p,
                          local_1d8._M_pred.SourceDir.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_SEP \"",0x21);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_EXT \"",0x21);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,local_278._M_dataplus._M_p,local_278._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
      }
      local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_70._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_70._M_impl.super__Rb_tree_header._M_header;
      local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_70._M_impl.super__Rb_tree_header._M_header._M_right =
           local_70._M_impl.super__Rb_tree_header._M_header._M_left;
      cmLocalGenerator::GetTargetDefines
                ((cmLocalGenerator *)local_280,local_228,local_38,(string *)p_Var21,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_70);
      if (local_70._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"# Preprocessor definitions for this target.\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_TARGET_DEFINITIONS_",0x1d);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,*(char **)(local_230 + 1),(long)local_230[1]._M_parent)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        for (p_Var17 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var17 != &local_70._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
          cmOutputConverter::EscapeForCMake((string *)local_2c0,(string *)(p_Var17 + 1));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
            operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"# The include file search paths:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (cmakefileStream,*(char **)(local_230 + 1),(long)local_230[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_TARGET_INCLUDE_PATH\n",0x15);
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar2 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"CMAKE_BUILD_TYPE","");
      psVar12 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_2c0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      pcVar5 = local_280;
      cmLocalGenerator::GetIncludeDirectories
                ((cmLocalGenerator *)local_280,&local_158,local_228,(string *)p_Var21,psVar12);
      pcVar20 = cmLocalGenerator::GetState((cmLocalGenerator *)pcVar5);
      psVar12 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar20);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar3 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + psVar12->_M_string_length);
      pcVar2 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c0,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
      bVar10 = cmMakefile::IsOn(pcVar2,(string *)local_2c0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      psVar12 = local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar10) {
        pcVar20 = cmLocalGenerator::GetState((cmLocalGenerator *)local_280);
        psVar12 = cmState::GetSourceDirectory_abi_cxx11_(pcVar20);
        local_1f8 = &local_1e8;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar3,pcVar3 + psVar12->_M_string_length);
        local_218 = &local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_130._M_dataplus._M_p,
                   local_130._M_dataplus._M_p + local_130._M_string_length);
        pbVar9 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var22._M_current =
             local_158.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        lVar23 = local_1f0;
        local_f0 = (uint *)&local_e0;
        local_d0 = (uint *)&local_c0;
        if (local_1f8 == &local_1e8) {
          uStack_d8 = uStack_1e0;
          uStack_d4 = uStack_1dc;
        }
        else {
          local_f0 = local_1f8;
        }
        local_e0 = CONCAT44(uStack_1e4,local_1e8);
        local_e8 = local_1f0;
        local_1f0 = 0;
        local_1e8 = local_1e8 & 0xffffff00;
        if (local_218 == &local_208) {
          uStack_b8 = uStack_200;
          uStack_b4 = uStack_1fc;
        }
        else {
          local_d0 = local_218;
        }
        local_c0 = CONCAT44(uStack_204,local_208);
        local_c8 = local_210;
        local_210 = 0;
        local_208 = local_208 & 0xffffff00;
        local_b0 = local_a0;
        local_218 = &local_208;
        local_1f8 = &local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_f0,lVar23 + (long)local_f0);
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_d0,local_c8 + (long)local_d0);
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_b0,local_a8 + (long)local_b0);
        local_178 = &local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_90,local_88 + (long)local_90);
        uVar8 = local_168._M_allocated_capacity._0_4_;
        local_1d8._M_pred.BinaryDir._M_string_length = local_170;
        uVar7 = local_188._M_allocated_capacity._0_4_;
        local_1d8._M_pred.SourceDir._M_string_length = local_190;
        local_2c0._0_8_ = local_2c0 + 0x10;
        local_1d8._M_pred.SourceDir._M_dataplus._M_p = (pointer)&local_1d8._M_pred.SourceDir.field_2
        ;
        if (local_198 == &local_188) {
          local_2c0._24_4_ = local_188._8_4_;
          local_2c0._28_4_ = local_188._12_4_;
        }
        else {
          local_2c0._0_8_ = local_198;
        }
        local_2c0._20_4_ = local_188._M_allocated_capacity._4_4_;
        local_2c0._16_4_ = local_188._M_allocated_capacity._0_4_;
        local_190 = 0;
        local_188._M_allocated_capacity._0_4_ = local_188._M_allocated_capacity._0_4_ & 0xffffff00;
        local_2a0._M_p = (pointer)&local_290;
        if (local_178 == &local_168) {
          local_290._8_4_ = local_168._8_4_;
          local_290._12_4_ = local_168._12_4_;
        }
        else {
          local_2a0._M_p = (pointer)local_178;
        }
        local_290._M_allocated_capacity._4_4_ = local_168._M_allocated_capacity._4_4_;
        local_290._M_allocated_capacity._0_4_ = local_168._M_allocated_capacity._0_4_;
        local_298 = local_170;
        local_170 = 0;
        local_168._M_allocated_capacity._0_4_ = local_168._M_allocated_capacity._0_4_ & 0xffffff00;
        if ((undefined1 *)local_2c0._0_8_ == local_2c0 + 0x10) {
          local_1d8._M_pred.SourceDir.field_2._M_allocated_capacity =
               CONCAT44(local_188._M_allocated_capacity._4_4_,uVar7);
          local_1d8._M_pred.SourceDir.field_2._8_4_ = local_2c0._24_4_;
          local_1d8._M_pred.SourceDir.field_2._12_4_ = local_2c0._28_4_;
        }
        else {
          local_1d8._M_pred.SourceDir._M_dataplus._M_p = (pointer)local_2c0._0_8_;
          local_1d8._M_pred.SourceDir.field_2._M_allocated_capacity = local_2c0._16_8_;
        }
        local_2c0._8_8_ = 0;
        local_2c0._16_8_ = local_2c0._16_8_ & 0xffffffffffffff00;
        local_1d8._M_pred.BinaryDir._M_dataplus._M_p = (pointer)&local_1d8._M_pred.BinaryDir.field_2
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p == &local_290) {
          local_1d8._M_pred.BinaryDir.field_2._M_allocated_capacity =
               CONCAT44(local_168._M_allocated_capacity._4_4_,uVar8);
          local_1d8._M_pred.BinaryDir.field_2._8_4_ = local_290._8_4_;
          local_1d8._M_pred.BinaryDir.field_2._12_4_ = local_290._12_4_;
        }
        else {
          local_1d8._M_pred.BinaryDir._M_dataplus._M_p = local_2a0._M_p;
          local_1d8._M_pred.BinaryDir.field_2._M_allocated_capacity =
               local_290._M_allocated_capacity;
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        local_2c0._0_8_ = local_2c0 + 0x10;
        local_198 = &local_188;
        local_178 = &local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_1d8._M_pred.SourceDir._M_dataplus._M_p,
                   local_1d8._M_pred.SourceDir._M_dataplus._M_p +
                   local_1d8._M_pred.SourceDir._M_string_length);
        local_258._M_allocated_capacity = (size_type)local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_1d8._M_pred.BinaryDir._M_dataplus._M_p,
                   local_1d8._M_pred.BinaryDir._M_dataplus._M_p +
                   local_1d8._M_pred.BinaryDir._M_string_length);
        local_2c0._0_8_ = local_2c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        local_2a0._M_p = (pointer)&local_290;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,local_258._M_allocated_capacity,
                   local_258._8_8_ + local_258._M_allocated_capacity);
        lVar23 = (long)pbVar9 - (long)_Var22._M_current >> 7;
        if (0 < lVar23) {
          lVar23 = lVar23 + 1;
          do {
            bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                     operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                _Var22);
            __first._M_current = _Var22._M_current;
            if (bVar10) goto LAB_0033e6b4;
            bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                     operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                _Var22._M_current + 1);
            __first._M_current = _Var22._M_current + 1;
            if (bVar10) goto LAB_0033e6b4;
            bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                     operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                _Var22._M_current + 2);
            __first._M_current = _Var22._M_current + 2;
            if (bVar10) goto LAB_0033e6b4;
            bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                     operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                _Var22._M_current + 3);
            __first._M_current = _Var22._M_current + 3;
            if (bVar10) goto LAB_0033e6b4;
            _Var22._M_current = _Var22._M_current + 4;
            lVar23 = lVar23 + -1;
          } while (1 < lVar23);
        }
        lVar23 = (long)pbVar9 - (long)_Var22._M_current >> 5;
        if (lVar23 == 1) {
LAB_0033e69c:
          bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                             ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,_Var22
                             );
          __first._M_current = _Var22._M_current;
          if (!bVar10) {
            __first._M_current = pbVar9;
          }
        }
        else if (lVar23 == 2) {
LAB_0033e687:
          bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                             ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,_Var22
                             );
          __first._M_current = _Var22._M_current;
          if (!bVar10) {
            _Var22._M_current = _Var22._M_current + 1;
            goto LAB_0033e69c;
          }
        }
        else {
          __first._M_current = pbVar9;
          if ((lVar23 == 3) &&
             (bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                       operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                  _Var22), __first._M_current = _Var22._M_current, !bVar10)) {
            _Var22._M_current = _Var22._M_current + 1;
            goto LAB_0033e687;
          }
        }
LAB_0033e6b4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        if ((long *)local_258._M_allocated_capacity != local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,local_248[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        _Var22._M_current = __first._M_current + 1;
        if (_Var22._M_current != pbVar9 && __first._M_current != pbVar9) {
          do {
            bVar10 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                     operator()(&local_1d8,_Var22);
            if (!bVar10) {
              std::__cxx11::string::operator=
                        ((string *)__first._M_current,(string *)_Var22._M_current);
              __first._M_current = __first._M_current + 1;
            }
            _Var22._M_current = _Var22._M_current + 1;
          } while (_Var22._M_current != pbVar9);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_pred.BinaryDir._M_dataplus._M_p != &local_1d8._M_pred.BinaryDir.field_2)
        {
          operator_delete(local_1d8._M_pred.BinaryDir._M_dataplus._M_p,
                          local_1d8._M_pred.BinaryDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_pred.SourceDir._M_dataplus._M_p != &local_1d8._M_pred.SourceDir.field_2)
        {
          operator_delete(local_1d8._M_pred.SourceDir._M_dataplus._M_p,
                          local_1d8._M_pred.SourceDir.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,
                          CONCAT44(local_168._M_allocated_capacity._4_4_,
                                   local_168._M_allocated_capacity._0_4_) + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,
                          CONCAT44(local_188._M_allocated_capacity._4_4_,
                                   local_188._M_allocated_capacity._0_4_) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_158,(iterator)__first._M_current,
                   (iterator)
                   local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        if (local_d0 != (uint *)&local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_f0 != (uint *)&local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,CONCAT44(uStack_204,local_208) + 1);
        }
        psVar12 = local_158.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,CONCAT44(uStack_1e4,local_1e8) + 1);
          psVar12 = local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; psVar12 != pbVar4; psVar12 = psVar12 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_2c0,(cmLocalGenerator *)local_280,&local_130,psVar12);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"\n",2);
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_70);
      this = local_280;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(local_230);
    } while (p_Var21 != local_40);
  }
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  local_278.field_2._M_allocated_capacity = 0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_2c0._0_8_ = local_2c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar18 = cmMakefile::GetProperty(pcVar2,(string *)local_2c0);
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (pcVar18 != (char *)0x0) {
    local_2c0._0_8_ = local_2c0 + 0x10;
    sVar19 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,pcVar18,pcVar18 + sVar19);
    cmSystemTools::ExpandListArgument
              ((string *)local_2c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_278,false);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  local_2c0._0_8_ = local_2c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar18 = cmGeneratorTarget::GetProperty(local_228,(string *)local_2c0);
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (pcVar18 != (char *)0x0) {
    local_2c0._0_8_ = local_2c0 + 0x10;
    sVar19 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,pcVar18,pcVar18 + sVar19);
    cmSystemTools::ExpandListArgument
              ((string *)local_2c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_278,false);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  if (local_278._M_dataplus._M_p != (pointer)local_278._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>
              (cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n",0x1d);
    sVar6 = local_278._M_string_length;
    if (local_278._M_dataplus._M_p != (pointer)local_278._M_string_length) {
      str._M_p = local_278._M_dataplus._M_p;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
        cmOutputConverter::EscapeForCMake((string *)local_2c0,(string *)str._M_p);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        str._M_p = str._M_p + 0x20;
      } while (str._M_p != (pointer)sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_278);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "  \"" << implicitLang.first << "\"\n";
  }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << implicitLang.first
                    << "\n";
    ImplicitDependFileMap const& implicitPairs = implicitLang.second;

    // for each file pair
    for (auto const& implicitPair : implicitPairs) {
      for (auto const& di : implicitPair.second) {
        cmakefileStream << "  \"" << di << "\" ";
        cmakefileStream << "\"" << implicitPair.first << "\"\n";
      }
    }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += implicitLang.first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if (cid && *cid) {
      cmakefileStream << "set(CMAKE_" << implicitLang.first
                      << "_COMPILER_ID \"" << cid << "\")\n";
    }

    if (implicitLang.first == "Fortran") {
      std::string smodSep =
        this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
      std::string smodExt =
        this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
      cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_SEP \"" << smodSep
                      << "\")\n";
      cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_EXT \"" << smodExt
                      << "\")\n";
    }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->GetTargetDefines(target, this->ConfigName, implicitLang.first,
                           defines);
    if (!defines.empty()) {
      /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << implicitLang.first << "\n";
      /* clang-format on */
      for (std::string const& define : defines) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(define)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }

    // Target-specific include directories:
    cmakefileStream << "\n"
                    << "# The include file search paths:\n";
    cmakefileStream << "set(CMAKE_" << implicitLang.first
                    << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;

    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target, implicitLang.first, config);
    std::string binaryDir = this->GetState()->GetBinaryDirectory();
    if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
      std::string const& sourceDir = this->GetState()->GetSourceDirectory();
      cmEraseIf(includes, ::NotInProjectDir(sourceDir, binaryDir));
    }
    for (std::string const& include : includes) {
      cmakefileStream << "  \""
                      << this->MaybeConvertToRelativePath(binaryDir, include)
                      << "\"\n";
    }
    cmakefileStream << "  )\n";
  }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if (const char* xform =
        this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (const char* xform =
        target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (!transformRules.empty()) {
    cmakefileStream << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for (std::string const& tr : transformRules) {
      cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(tr) << "\n";
    }
    cmakefileStream << "  )\n";
  }
}